

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  double *pdVar5;
  bool *pbVar6;
  long lVar7;
  int *piVar8;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  long in_RDI;
  double dVar9;
  int x_6;
  int x_5;
  double blendFactorSide;
  int x_4;
  TPZManVector<double,_3> projectedPoint;
  int subSide;
  int subSideIndex;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  int x_3;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> neighXi_1;
  int sidedim;
  int x_2;
  int x_1;
  int currentNode;
  int iNode_1;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_double> sidePhi;
  int nSideNodes;
  MElementType sideType;
  TPZManVector<double,_3> sideXi;
  TPZGeoElSide gelside;
  int side_1;
  int sideIndex_1;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<27,_double> projectedPointOverSide;
  TPZManVector<double,_20> blendFactor;
  int side;
  int sideIndex;
  TPZManVector<bool,_20> isRegularMapping;
  int x;
  int iNode;
  TPZFNMatrix<9,_double> phi;
  TPZManVector<double,_3> neighXi;
  REAL zero;
  TPZFNMatrix<9,_double> notUsedHereMat;
  TPZManVector<double,_3> notUsedHereVec;
  TPZGeoMesh *gmesh;
  int in_stack_fffffffffffff30c;
  TPZManVector<double,_20> *in_stack_fffffffffffff310;
  TPZGeoMesh *in_stack_fffffffffffff318;
  TPZGeoMesh *in_stack_fffffffffffff320;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffff328;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff330;
  double *in_stack_fffffffffffff338;
  TPZManVector<double,_20> *in_stack_fffffffffffff340;
  int64_t in_stack_fffffffffffff348;
  TPZFNMatrix<27,_double> *in_stack_fffffffffffff350;
  double *in_stack_fffffffffffff358;
  _func_int **pp_Var10;
  TPZVec<double> *in_stack_fffffffffffff360;
  TPZVec<double> *in_stack_fffffffffffff368;
  TPZGeoElSide *in_stack_fffffffffffff370;
  _func_int **in_stack_fffffffffffff378;
  double *in_stack_fffffffffffff380;
  TPZFMatrix<double> *in_stack_fffffffffffff388;
  int64_t in_stack_fffffffffffff3b0;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffff3b8;
  int local_b40;
  int local_b3c;
  TPZVec<double> *local_b38;
  int local_b2c;
  TPZVec<double> local_b20;
  int in_stack_fffffffffffff518;
  int in_stack_fffffffffffff51c;
  _func_int **in_stack_fffffffffffff520;
  TPZVec<double> *in_stack_fffffffffffff528;
  int *in_stack_fffffffffffff530;
  TPZFMatrix<double> *in_stack_fffffffffffff558;
  TPZFMatrix<double> *in_stack_fffffffffffff560;
  TPZVec<double> *in_stack_fffffffffffff568;
  int in_stack_fffffffffffff574;
  int local_a4c;
  TPZVec<double> local_a28;
  TPZFMatrix<double> *in_stack_fffffffffffff5f8;
  TPZVec<double> *in_stack_fffffffffffff600;
  TPZVec<double> *in_stack_fffffffffffff608;
  int in_stack_fffffffffffff610;
  int in_stack_fffffffffffff614;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffff618;
  int local_9b0;
  int local_9ac;
  int local_9a4;
  TPZFMatrix<double> *in_stack_fffffffffffff668;
  TPZVec<double> *in_stack_fffffffffffff670;
  TPZVec<double> *in_stack_fffffffffffff678;
  int in_stack_fffffffffffff684;
  size_t in_stack_fffffffffffff728;
  char *in_stack_fffffffffffff730;
  TPZGeoElSide local_848;
  int local_830;
  int local_82c;
  undefined8 local_828;
  undefined8 local_6b0;
  undefined8 local_538;
  undefined8 local_3c0;
  TPZVec<double> local_3b8 [6];
  int local_2f4;
  int local_2f0;
  undefined1 local_2e9;
  TPZVec<bool> local_2e8;
  int local_2b0;
  int local_2ac;
  undefined4 local_1c4;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_150;
  undefined8 local_68;
  TPZGeoMesh *local_28;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (*(long *)(in_RDI + 0x18) == 0) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  }
  local_28 = TPZGeoEl::Mesh(*(TPZGeoEl **)(in_RDI + 0x18));
  local_68 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,(int64_t)in_stack_fffffffffffff338
             ,(double *)in_stack_fffffffffffff330);
  local_150 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff350,in_stack_fffffffffffff348,
             (int64_t)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  local_168 = 0x3d06849b86a12b9b;
  (*local_20->_vptr_TPZVec[3])(local_20,3);
  local_170 = 0;
  TPZVec<double>::Fill
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,(int64_t)in_stack_fffffffffffff350,
             in_stack_fffffffffffff348);
  iVar4 = TPZGeoElSideIndex::ElementIndex((TPZGeoElSideIndex *)(in_RDI + 0x20));
  if (iVar4 == -1) {
    TPZFNMatrix<9,_double>::TPZFNMatrix
              (in_stack_fffffffffffff330,(int64_t)in_stack_fffffffffffff328,
               (int64_t)in_stack_fffffffffffff320);
    pztopology::TPZLine::TShape<double>
              ((TPZVec<double> *)in_stack_fffffffffffff330,
               (TPZFMatrix<double> *)in_stack_fffffffffffff328,
               (TPZFMatrix<double> *)in_stack_fffffffffffff320);
    for (local_2ac = 0; local_2ac < 2; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 < 3; local_2b0 = local_2b0 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff328,(int64_t)in_stack_fffffffffffff320);
        dVar9 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff328,(int64_t)in_stack_fffffffffffff320);
        dVar1 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](local_20,(long)local_2b0);
        *pdVar5 = dVar9 * dVar1 + *pdVar5;
      }
    }
    local_2e9 = 0;
    TPZManVector<bool,_20>::TPZManVector
              ((TPZManVector<bool,_20> *)in_stack_fffffffffffff340,
               (int64_t)in_stack_fffffffffffff338,(bool *)in_stack_fffffffffffff330);
    for (local_2f0 = 0; local_2f0 < 0; local_2f0 = local_2f0 + 1) {
      local_2f4 = local_2f0 + 2;
      bVar2 = pztopology::TPZLine::CheckProjectionForSingularity<double>(&local_2f4,local_18);
      pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)local_2f0);
      *pbVar6 = bVar2;
    }
    local_3c0 = 0;
    TPZManVector<double,_20>::TPZManVector
              (in_stack_fffffffffffff340,(int64_t)in_stack_fffffffffffff338,
               (double *)in_stack_fffffffffffff330);
    local_538 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff350,in_stack_fffffffffffff348,
               (int64_t)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
    local_6b0 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff350,in_stack_fffffffffffff348,
               (int64_t)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
    local_828 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff350,in_stack_fffffffffffff348,
               (int64_t)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
    for (local_82c = 0; local_82c < 0; local_82c = local_82c + 1) {
      local_830 = local_82c + 2;
      pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)local_82c);
      if ((*pbVar6 & 1U) != 0) {
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff330,
                   (TPZGeoElSideIndex *)in_stack_fffffffffffff328,in_stack_fffffffffffff320);
        bVar2 = IsLinearMapping(in_stack_fffffffffffff3b8,
                                (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
        if ((bVar2) || (iVar3 = TPZGeoElSide::Exists(&local_848), iVar3 == 0)) {
          pdVar5 = TPZVec<double>::operator[](local_3b8,(long)local_82c);
          *pdVar5 = 0.0;
          local_1c4 = 0xd;
        }
        else {
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff330,
                     (int64_t)in_stack_fffffffffffff328);
          pztopology::TPZLine::MapToSide<double>
                    (in_stack_fffffffffffff684,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                     in_stack_fffffffffffff668);
          pztopology::TPZLine::Type(local_830);
          iVar3 = MElementType_NNodes((MElementType)in_stack_fffffffffffff310);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (in_stack_fffffffffffff330,(int64_t)in_stack_fffffffffffff328,
                     (int64_t)in_stack_fffffffffffff320);
          TPZFMatrix<double>::Resize
                    (in_stack_fffffffffffff388,(int64_t)in_stack_fffffffffffff380,
                     (int64_t)in_stack_fffffffffffff378);
          GetSideShapeFunction<pzgeom::TPZGeoLinear>
                    (in_stack_fffffffffffff574,in_stack_fffffffffffff568,in_stack_fffffffffffff560,
                     in_stack_fffffffffffff558);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff330,
                     (int64_t)in_stack_fffffffffffff328);
          for (local_9a4 = 0; local_9a4 < iVar3; local_9a4 = local_9a4 + 1) {
            pztopology::TPZLine::SideNodeLocId
                      ((int)in_stack_fffffffffffff310,in_stack_fffffffffffff30c);
            for (local_9ac = 0; local_9ac < 3; local_9ac = local_9ac + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              dVar9 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              *pdVar5 = dVar9 * dVar1 + *pdVar5;
            }
            pztopology::TPZLine::ParametricDomainNodeCoord
                      ((int)((ulong)in_stack_fffffffffffff320 >> 0x20),
                       (TPZVec<double> *)in_stack_fffffffffffff318);
            for (local_9b0 = 0; local_9b0 < 1; local_9b0 = local_9b0 + 1) {
              pdVar5 = TPZVec<double>::operator[]
                                 ((TPZVec<double> *)&stack0xfffffffffffff660,(long)local_9b0);
              dVar9 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              *pdVar5 = dVar9 * dVar1 + *pdVar5;
            }
          }
          TPZVec<double>::operator[](local_3b8,(long)local_82c);
          pztopology::TPZLine::BlendFactorForSide<double>
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                     (double *)in_stack_fffffffffffff520,
                     (TPZVec<double> *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518)
                    );
          TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff310);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff330,
                     (int64_t)in_stack_fffffffffffff328);
          bVar2 = MapToNeighSide<double>
                            (in_stack_fffffffffffff618,in_stack_fffffffffffff614,
                             in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                             in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
          if (bVar2) {
            TPZManVector<double,_3>::TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
                       (int64_t)in_stack_fffffffffffff338,(double *)in_stack_fffffffffffff330);
            Neighbour(in_stack_fffffffffffff328,(int)((ulong)in_stack_fffffffffffff320 >> 0x20),
                      in_stack_fffffffffffff318);
            TPZGeoElSide::X(in_stack_fffffffffffff370,in_stack_fffffffffffff368,
                            in_stack_fffffffffffff360);
            for (local_a4c = 0; local_a4c < 3; local_a4c = local_a4c + 1) {
              pdVar5 = TPZVec<double>::operator[](&local_a28,(long)local_a4c);
              dVar9 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
              *pdVar5 = dVar9;
            }
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff320);
            pztopology::TPZLine::LowerDimensionSides
                      ((int)((ulong)in_stack_fffffffffffff320 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_fffffffffffff318,
                       (int)((ulong)in_stack_fffffffffffff310 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff320);
            pztopology::TPZLine::LowerDimensionSides
                      ((int)((ulong)in_stack_fffffffffffff320 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_fffffffffffff318);
            in_stack_fffffffffffff3b8 =
                 (TPZGeoBlend<pzgeom::TPZGeoLinear> *)
                 TPZVec<int>::NElements((TPZVec<int> *)&stack0xfffffffffffff568);
            for (in_stack_fffffffffffff51c = (int)in_stack_fffffffffffff3b8;
                lVar7 = (long)in_stack_fffffffffffff51c,
                in_stack_fffffffffffff3b0 =
                     TPZVec<int>::NElements((TPZVec<int> *)&stack0xfffffffffffff520),
                lVar7 < in_stack_fffffffffffff3b0;
                in_stack_fffffffffffff51c = in_stack_fffffffffffff51c + 1) {
              piVar8 = TPZVec<int>::operator[]
                                 ((TPZVec<int> *)&stack0xfffffffffffff520,
                                  (long)in_stack_fffffffffffff51c);
              iVar3 = (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20);
              in_stack_fffffffffffff518 = *piVar8;
              pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)(in_stack_fffffffffffff518 + -2));
              if (((*pbVar6 & 1U) != 0) &&
                 (bVar2 = IsLinearMapping(in_stack_fffffffffffff3b8,iVar3), !bVar2)) {
                TPZManVector<double,_3>::TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
                           (int64_t)in_stack_fffffffffffff338,(double *)in_stack_fffffffffffff330);
                for (local_b2c = 0; local_b2c < 1; local_b2c = local_b2c + 1) {
                  in_stack_fffffffffffff388 =
                       (TPZFMatrix<double> *)
                       TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
                  in_stack_fffffffffffff378 =
                       (in_stack_fffffffffffff388->super_TPZMatrix<double>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable;
                  in_stack_fffffffffffff380 = TPZVec<double>::operator[](&local_b20,(long)local_b2c)
                  ;
                  *in_stack_fffffffffffff380 = (double)in_stack_fffffffffffff378;
                }
                local_b38 = (TPZVec<double> *)0xbff0000000000000;
                pztopology::TPZLine::BlendFactorForSide<double>
                          (in_stack_fffffffffffff530,in_stack_fffffffffffff528,
                           (double *)in_stack_fffffffffffff520,
                           (TPZVec<double> *)
                           CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518));
                for (local_b3c = 0; local_b3c < 3; local_b3c = local_b3c + 1) {
                  in_stack_fffffffffffff368 = local_b38;
                  in_stack_fffffffffffff370 =
                       (TPZGeoElSide *)
                       TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
                  pp_Var10 = (in_stack_fffffffffffff370->super_TPZSavable)._vptr_TPZSavable;
                  in_stack_fffffffffffff360 =
                       (TPZVec<double> *)
                       TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff328,
                                  (int64_t)in_stack_fffffffffffff320);
                  dVar9 = (double)pp_Var10 - (double)in_stack_fffffffffffff360->_vptr_TPZVec;
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                                      (int64_t)in_stack_fffffffffffff328,
                                      (int64_t)in_stack_fffffffffffff320);
                  *pdVar5 = -(double)in_stack_fffffffffffff368 * dVar9 + *pdVar5;
                }
                TPZManVector<double,_3>::~TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
              }
            }
            for (local_b40 = 0; local_b40 < 3; local_b40 = local_b40 + 1) {
              in_stack_fffffffffffff340 =
                   (TPZManVector<double,_20> *)TPZVec<double>::operator[](local_3b8,(long)local_82c)
              ;
              in_stack_fffffffffffff330 =
                   (TPZFNMatrix<9,_double> *)
                   (in_stack_fffffffffffff340->super_TPZVec<double>)._vptr_TPZVec;
              in_stack_fffffffffffff338 =
                   TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)in_stack_fffffffffffff330,
                              (int64_t)in_stack_fffffffffffff328,(int64_t)in_stack_fffffffffffff320)
              ;
              in_stack_fffffffffffff320 = (TPZGeoMesh *)*in_stack_fffffffffffff338;
              in_stack_fffffffffffff328 =
                   (TPZGeoBlend<pzgeom::TPZGeoLinear> *)
                   TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff330->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff328,(int64_t)in_stack_fffffffffffff320)
              ;
              in_stack_fffffffffffff310 =
                   (TPZManVector<double,_20> *)
                   ((double)in_stack_fffffffffffff320 -
                   (double)(in_stack_fffffffffffff328->super_TPZGeoLinear).
                           super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
                           _vptr_TPZSavable);
              in_stack_fffffffffffff318 =
                   (TPZGeoMesh *)TPZVec<double>::operator[](local_20,(long)local_b40);
              (in_stack_fffffffffffff318->super_TPZSavable)._vptr_TPZSavable =
                   (_func_int **)
                   ((double)in_stack_fffffffffffff330 * (double)in_stack_fffffffffffff310 +
                   (double)(in_stack_fffffffffffff318->super_TPZSavable)._vptr_TPZSavable);
            }
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1677e3f);
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1677e4c);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1677e59);
            TPZManVector<double,_3>::~TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
            local_1c4 = 0;
          }
          else {
            local_1c4 = 0xd;
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1677e98);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1677eb2);
      }
    }
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x1677f5d);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x1677f6a);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x1677f77);
    TPZManVector<double,_20>::~TPZManVector(in_stack_fffffffffffff310);
    TPZManVector<bool,_20>::~TPZManVector((TPZManVector<bool,_20> *)in_stack_fffffffffffff310);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1677f9e);
    local_1c4 = 0;
  }
  else {
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffff330,
               (int64_t)in_stack_fffffffffffff328);
    iVar3 = (int)((ulong)in_stack_fffffffffffff320 >> 0x20);
    bVar2 = MapToNeighSide<double>
                      (in_stack_fffffffffffff618,in_stack_fffffffffffff614,in_stack_fffffffffffff610
                       ,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
                       in_stack_fffffffffffff5f8);
    if (!bVar2) {
      pzinternal::DebugStopImpl(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    }
    Neighbour(in_stack_fffffffffffff328,iVar3,in_stack_fffffffffffff318);
    TPZGeoElSide::X(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1676eb1);
    local_1c4 = 1;
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1677fb6);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff310);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}